

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_data.c
# Opt level: O1

int cmd_data_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  char ***argv_p;
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  int argc;
  int opt_index;
  option options [13];
  int local_210;
  int local_20c;
  undefined8 local_208;
  char ***local_200;
  int *local_1f8;
  ly_out **local_1f0;
  ly_set *local_1e8;
  undefined1 local_1dc [4];
  undefined1 local_1d8 [424];
  
  local_210 = 0;
  memcpy(local_1d8,&PTR_anon_var_dwarf_7a52_0011d480,0x1a0);
  yo->data_parse_options = 0x20000;
  yo->data_validate_options = 4;
  argv_p = &yo->argv;
  iVar2 = parse_cmdline(cmdline,&local_210,argv_p);
  if (iVar2 != 0) {
    return iVar2;
  }
  local_1e8 = &yo->data_xpath;
  local_1f0 = &yo->out;
  local_208 = 0;
  local_20c = 0;
  local_200 = posv;
  local_1f8 = posc;
LAB_00105dd1:
  while (iVar3 = getopt_long(local_210,*argv_p,commands[4].optstring,local_1d8,local_1dc),
        iVar2 = _optind, iVar3 < 0x52) {
    if (iVar3 == 0x46) goto LAB_00105e4d;
    if (iVar3 != 0x4f) {
      if (iVar3 == -1) {
        *local_200 = *argv_p + _optind;
        *local_1f8 = local_210 - iVar2;
        return local_20c;
      }
      goto switchD_00105dff_caseD_3;
    }
    if ((yo->data_operational).path != (char *)0x0) {
      pcVar7 = "The operational datastore (-O) cannot be set multiple times.";
      goto LAB_00106069;
    }
    (yo->data_operational).path = _optarg;
  }
  uVar6 = (ulong)(iVar3 - 100);
  switch(uVar6) {
  case 0:
    iVar2 = yo_opt_update_data_default(_optarg,yo);
    if (iVar2 != 0) {
      yl_log('\x01',"Unknown default mode %s.",_optarg);
      pcVar7 = 
      "  -d MODE, --default=MODE\n                Print data with default values, according to the MODE\n                (to print attributes, ietf-netconf-with-defaults model\n                must be loaded):\n      all             - Add missing default nodes.\n      all-tagged      - Add missing default nodes and mark all the default\n                        nodes with the attribute.\n      trim            - Remove all nodes with a default value.\n      implicit-tagged - Add missing nodes and mark them with the attribute."
      ;
      goto LAB_001060db;
    }
    goto LAB_00105dd1;
  case 1:
    *(byte *)&yo->data_validate_options = (byte)yo->data_validate_options | 2;
    goto LAB_00105dd1;
  case 2:
    iVar2 = yl_opt_update_data_out_format(_optarg,yo);
    if (iVar2 != 0) {
      puts(
          "  -f FORMAT, --format=FORMAT\n                Print the data in one of the following formats:\n                xml, json, lyb\n                Note that the LYB format requires the -o option specified."
          );
      return 1;
    }
    goto LAB_00105dd1;
  case 3:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
    goto switchD_00105dff_caseD_3;
  case 4:
    cmd_data_help();
    return 1;
  case 9:
    yo->data_merge = '\x01';
    goto LAB_00105dd1;
  case 10:
    pbVar1 = (byte *)((long)&yo->data_parse_options + 2);
    *pbVar1 = *pbVar1 & 0xfd;
    goto LAB_00105dd1;
  case 0xb:
    if (*local_1f0 != (ly_out *)0x0) {
      pcVar7 = "Only a single output can be specified.";
      goto LAB_00106069;
    }
    iVar2 = ly_out_new_filepath(_optarg);
    pcVar7 = _optarg;
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      yl_log('\x01',"Unable open output file %s (%s).",pcVar7,pcVar5);
      return 1;
    }
    goto LAB_00105dd1;
  case 0x10:
    if ((char)local_208 != '\0') {
      pcVar7 = "The data type (-t) cannot be set multiple times.";
      goto LAB_00106069;
    }
    iVar2 = yl_opt_update_data_type(_optarg,yo);
    local_208 = CONCAT71((int7)(uVar6 >> 8),1);
    if (iVar2 != 0) {
      yl_log('\x01',"Unknown data tree type %s.",_optarg);
      pcVar7 = 
      "  -t TYPE, --type=TYPE\n                Specify data tree type in the input data file(s):\n        data          - Complete datastore with status data (default type).\n        config        - Configuration datastore (without status data).\n        get           - Result of the NETCONF <get> operation.\n        getconfig     - Result of the NETCONF <get-config> operation.\n        edit          - Content of the NETCONF <edit-config> operation.\n        rpc           - Content of the NETCONF <rpc> message, defined as YANG\'s\n                        RPC/Action input statement.\n        nc-rpc        - Similar to \'rpc\' but expect and check also the NETCONF\n                        envelopes <rpc> or <action>.\n        reply         - Reply to the RPC/Action. Note that the reply data are\n                        expected inside a container representing the original\n                        RPC/Action. This is necessary to identify appropriate\n                        data definitions in the schema module.\n        nc-reply      - Similar to \'reply\' but expect and check also the NETCONF\n                        envelope <rpc-reply> with output data nodes as direct\n                        descendants. The original RPC/action invocation is expected\n                        in a separate parameter \'-R\' and is parsed as \'nc-rpc\'.\n        notif         - Notification instance (content of the <notification>\n                        element without <eventTime>).\n        nc-notif      - Similar to \'notif\' but expect and check also the NETCONF\n                        envelope <notification> with element <eventTime> and its\n                        sibling as the actual notification."
      ;
      goto LAB_001060db;
    }
    goto LAB_00105dd1;
  case 0x14:
    iVar2 = ly_set_add(local_1e8,_optarg,0,0);
    if (iVar2 != 0) {
      yl_log('\x01',"Storing XPath \"%s\" failed.",_optarg);
      return 1;
    }
    goto LAB_00105dd1;
  default:
    if (iVar3 == 0x52) {
      if ((yo->reply_rpc).path != (char *)0x0) {
        pcVar7 = "The PRC of the reply (-R) cannot be set multiple times.";
        goto LAB_00106069;
      }
      (yo->reply_rpc).path = _optarg;
      goto LAB_00105dd1;
    }
switchD_00105dff_caseD_3:
    pcVar7 = "Unknown option.";
LAB_00106069:
    yl_log('\x01',pcVar7);
    return 1;
  }
LAB_00105e4d:
  iVar2 = yo_opt_update_data_in_format(_optarg,yo);
  if (iVar2 != 0) {
    yl_log('\x01',"Unknown input format %s.",_optarg);
    pcVar7 = 
    "  -F FORMAT, --in-format=FORMAT\n                Load the data in one of the following formats:\n                xml, json, lyb\n                If input format not specified, it is detected from the file extension."
    ;
LAB_001060db:
    puts(pcVar7);
    return 1;
  }
  goto LAB_00105dd1;
}

Assistant:

int
cmd_data_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"defaults",    required_argument, NULL, 'd'},
        {"present",     no_argument,       NULL, 'e'},
        {"format",      required_argument, NULL, 'f'},
        {"in-format",   required_argument, NULL, 'F'},
        {"help",        no_argument,       NULL, 'h'},
        {"merge",       no_argument,       NULL, 'm'},
        {"output",      required_argument, NULL, 'o'},
        {"operational", required_argument, NULL, 'O'},
        {"reply-rpc",   required_argument, NULL, 'R'},
        {"not-strict",  no_argument,       NULL, 'n'},
        {"type",        required_argument, NULL, 't'},
        {"xpath",       required_argument, NULL, 'x'},
        {NULL, 0, NULL, 0}
    };

    uint8_t data_type_set = 0;

    yo->data_parse_options = YL_DEFAULT_DATA_PARSE_OPTIONS;
    yo->data_validate_options = YL_DEFAULT_DATA_VALIDATE_OPTIONS;

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_DATA].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'd': /* --default */
            if (yo_opt_update_data_default(optarg, yo)) {
                YLMSG_E("Unknown default mode %s.", optarg);
                cmd_data_help_default();
                return 1;
            }
            break;
        case 'f': /* --format */
            if (yl_opt_update_data_out_format(optarg, yo)) {
                cmd_data_help_format();
                return 1;
            }
            break;
        case 'F': /* --in-format */
            if (yo_opt_update_data_in_format(optarg, yo)) {
                YLMSG_E("Unknown input format %s.", optarg);
                cmd_data_help_in_format();
                return 1;
            }
            break;
        case 'o': /* --output */
            if (yo->out) {
                YLMSG_E("Only a single output can be specified.");
                return 1;
            } else {
                if (ly_out_new_filepath(optarg, &yo->out)) {
                    YLMSG_E("Unable open output file %s (%s).", optarg, strerror(errno));
                    return 1;
                }
            }
            break;
        case 'O':   /* --operational */
            if (yo->data_operational.path) {
                YLMSG_E("The operational datastore (-O) cannot be set multiple times.");
                return 1;
            }
            yo->data_operational.path = optarg;
            break;
        case 'R':   /* --reply-rpc */
            if (yo->reply_rpc.path) {
                YLMSG_E("The PRC of the reply (-R) cannot be set multiple times.");
                return 1;
            }
            yo->reply_rpc.path = optarg;
            break;
        case 'e': /* --present */
            yo->data_validate_options |= LYD_VALIDATE_PRESENT;
            break;
        case 'm': /* --merge */
            yo->data_merge = 1;
            break;
        case 'n': /* --not-strict */
            yo->data_parse_options &= ~LYD_PARSE_STRICT;
            break;
        case 't': /* --type */
            if (data_type_set) {
                YLMSG_E("The data type (-t) cannot be set multiple times.");
                return 1;
            }

            if (yl_opt_update_data_type(optarg, yo)) {
                YLMSG_E("Unknown data tree type %s.", optarg);
                cmd_data_help_type();
                return 1;
            }

            data_type_set = 1;
            break;

        case 'x': /* --xpath */
            if (ly_set_add(&yo->data_xpath, optarg, 0, NULL)) {
                YLMSG_E("Storing XPath \"%s\" failed.", optarg);
                return 1;
            }
            break;

        case 'h': /* --help */
            cmd_data_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return rc;
}